

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O2

int gen_union_fields(fb_output_t *out,char *st,int n,char *s,fb_compound_type_t *ct,int is_vector)

{
  ushort uVar1;
  uint16_t uVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  ulong extraout_RAX;
  ulong uVar6;
  undefined4 in_register_00000014;
  fb_symbol_t *pfVar7;
  char *pcVar8;
  char *__format;
  FILE *__stream;
  fb_scoped_name_t snref;
  fb_scoped_name_t snu;
  
  pcVar8 = "vector_value";
  if (is_vector == 0) {
    pcVar8 = "value";
  }
  memset(&snref,0,0xe8);
  memset(&snu,0,0xe8);
  fb_compound_name(ct,&snref);
  pfVar7 = (fb_symbol_t *)&ct->members;
  uVar6 = extraout_RAX;
  do {
    do {
      pfVar7 = pfVar7->link;
      if (pfVar7 == (fb_symbol_t *)0x0) {
        return (int)uVar6;
      }
      uVar1 = pfVar7[1].kind;
      uVar6 = (ulong)uVar1;
    } while (uVar1 == 0);
    lVar4 = pfVar7->ident->len;
    pcVar3 = pfVar7->ident->text;
    if (uVar1 == 0xb) {
      __stream = (FILE *)out->fp;
      __format = "__%sbuild_union_string_%s_field(%s, %s_%.*s, %s, %.*s)\n";
    }
    else {
      if (uVar1 != 0xf) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
                ,0x630,"internal error: unexpected union member type");
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
                      ,0x630,
                      "int gen_union_fields(fb_output_t *, const char *, int, const char *, fb_compound_type_t *, int)"
                     );
      }
      fb_compound_name((fb_compound_type_t *)pfVar7[1].link,&snu);
      uVar2 = (pfVar7[1].link)->kind;
      if (uVar2 == 1) {
        __stream = (FILE *)out->fp;
        __format = "__%sbuild_union_struct_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n";
      }
      else {
        if (uVar2 != 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
                  ,0x626,"internal error: unexpected union member compound type");
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
                        ,0x626,
                        "int gen_union_fields(fb_output_t *, const char *, int, const char *, fb_compound_type_t *, int)"
                       );
        }
        __stream = (FILE *)out->fp;
        __format = "__%sbuild_union_table_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n";
      }
    }
    uVar5 = fprintf(__stream,__format,out,pcVar8,out,st,CONCAT44(in_register_00000014,n),s,&snref,
                    (ulong)(uint)lVar4,pcVar3);
    uVar6 = (ulong)uVar5;
  } while( true );
}

Assistant:

static int gen_union_fields(fb_output_t *out, const char *st, int n, const char *s,
        fb_compound_type_t *ct, int is_vector)
{
    const char *nsc = out->nsc;
    fb_symbol_t *sym;
    fb_member_t *member;
    const char *su;
    int nu;
    fb_scoped_name_t snref;
    fb_scoped_name_t snu;
    const char *kind = is_vector ? "vector_value" : "value";

    fb_clear(snref);
    fb_clear(snu);
    fb_compound_name(ct, &snref);
    for (sym = ct->members; sym; sym = sym->link) {
        member = (fb_member_t *)sym;
        symbol_name(sym, &nu, &su);
        switch (member->type.type) {
        case vt_missing:
            break;
        case vt_compound_type_ref:
            fb_compound_name(member->type.ct, &snu);
            switch (member->type.ct->symbol.kind) {
            case fb_is_table:
                fprintf(out->fp,
                        "__%sbuild_union_table_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n",
                        nsc, kind, nsc, st, n, s, snref.text, nu, su, snu.text);
                break;
            case fb_is_struct:
                fprintf(out->fp,
                        "__%sbuild_union_struct_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n",
                        nsc, kind, nsc, st, n, s, snref.text, nu, su, snu.text);
                break;
            default:
                gen_panic(out, "internal error: unexpected union member compound type");
                return -1;
            }
            break;
        case vt_string_type:
            fprintf(out->fp,
                    "__%sbuild_union_string_%s_field(%s, %s_%.*s, %s, %.*s)\n",
                    nsc, kind, nsc, st, n, s, snref.text, nu, su);
            break;
        default:
            gen_panic(out, "internal error: unexpected union member type");
            return -1;
        }
    }
    return 0;
}